

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Osc::renderNoise(V2Osc *this,float *dest,int nsamples)

{
  float fVar1;
  float x;
  float h;
  float n;
  int i;
  uint32_t seed;
  V2LRC flt;
  int nsamples_local;
  float *dest_local;
  V2Osc *this_local;
  
  _i = this->nf;
  n = (float)this->nseed;
  flt.l = (float)nsamples;
  unique0x1000009c = dest;
  for (h = 0.0; (int)h < (int)flt.l; h = (float)((int)h + 1)) {
    fVar1 = frandom((uint32_t *)&n);
    fVar1 = V2LRC::step((V2LRC *)&i,fVar1,this->nffrq,this->nfres);
    output(this,stack0xffffffffffffffe8 + (int)h,
           this->gain * (this->nfres * ((float)i + fVar1) + (float)seed));
  }
  this->nseed = (uint32_t)n;
  return;
}

Assistant:

void renderNoise(float *dest, int nsamples)
    {
        COVER("Osc noise");

        V2LRC flt = nf;
        uint32_t seed = nseed;

        for (int i=0; i < nsamples; i++)
        {
            // uniform random value (noise)
            float n = frandom(&seed);

            // filter
            float h = flt.step(n, nffrq, nfres);
            float x = nfres*(flt.l + h) + flt.b;

            output(dest + i, gain * x);
        }

        flt = nf;
        nseed = seed;
    }